

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::detail::
storage_t<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::construct_value
          (storage_t<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *this,
          value_type *v)

{
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this,&v->_value);
  *(undefined2 *)(this + 0x18) = *(undefined2 *)&v->_has_value;
  std::
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ::vector((vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
            *)(this + 0x20),&(v->_ts)._samples);
  this[0x38] = (storage_t<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>)
               (v->_ts)._dirty;
  return;
}

Assistant:

void construct_value( value_type const & v )
    {
        ::new( value_ptr() ) value_type( v );
    }